

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<kj::_::Tuple<>_> __thiscall
kj::parse::Times_<kj::parse::Exactly_<char>_>::
Impl<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_>::apply
          (Impl<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_> *this,
          Exactly_<char> *subParser,uint count,IteratorInput<char,_const_char_*> *input)

{
  char cVar1;
  Impl<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_> IVar2;
  char *pcVar3;
  bool bVar4;
  
  pcVar3 = input->pos;
  cVar1 = subParser->expected;
  do {
    bVar4 = count == 0;
    count = count - 1;
    if (bVar4) {
      IVar2 = (Impl<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_>)0x1;
LAB_00261fba:
      *this = IVar2;
      return (Maybe<kj::_::Tuple<>_>)SUB82(this,0);
    }
    if ((pcVar3 == input->end) || (*pcVar3 != cVar1)) {
      IVar2 = (Impl<kj::parse::IteratorInput<char,_const_char_*>,_kj::_::Tuple<>_>)0x0;
      goto LAB_00261fba;
    }
    pcVar3 = pcVar3 + 1;
    input->pos = pcVar3;
  } while( true );
}

Assistant:

static Maybe<Tuple<>> apply(const SubParser& subParser, uint count, Input& input) {
    uint actualCount = 0;

    while (actualCount < count) {
      if (input.atEnd()) {
        return nullptr;
      } else KJ_IF_MAYBE(subResult, subParser(input)) {
        ++actualCount;
      } else {
        return nullptr;
      }
    }

    return tuple();
  }